

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgthd(char *tmplt,char *card,int *hdtype,int *status)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  int *in_RCX;
  undefined4 *in_RDX;
  char *in_RSI;
  char *in_RDI;
  double dval;
  int remainlen;
  int lentok1;
  int tstatus;
  int more;
  int vlen;
  int len;
  char tvalue [140];
  char *loc;
  char *suffix;
  char *tok;
  char comment [140];
  char value [140];
  char keyname [75];
  double local_268;
  undefined4 uVar7;
  undefined4 uVar8;
  int local_24c;
  char local_248 [88];
  int *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  char *local_1a8;
  char *local_1a0;
  char local_198 [48];
  int *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char local_108 [9];
  char acStack_ff [135];
  char local_78 [80];
  int *local_28;
  undefined4 *local_20;
  char *local_18;
  char *local_10;
  int local_4;
  
  uVar8 = 0;
  uVar7 = 0;
  if (*in_RCX < 1) {
    *in_RSI = '\0';
    *in_RDX = 0;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (((*in_RDI < ' ') || (' ' < *in_RDI)) || (iVar2 = strncmp(in_RDI,"        ",8), iVar2 != 0))
    {
      local_1a0 = local_10;
      local_78[0] = '\0';
      local_108[0] = '\0';
      local_198[0] = '\0';
      sVar5 = strspn(local_10," ");
      local_1a0 = local_1a0 + (int)sVar5;
      iVar2 = strncmp(local_1a0,"--------------------",0x14);
      if (iVar2 == 0) {
        *local_28 = 0xcf;
        local_4 = 0xcf;
      }
      else {
        if (*local_1a0 == '-') {
          *local_20 = 0xffffffff;
          local_1a0 = local_1a0 + 1;
          sVar5 = strspn(local_1a0," ");
          local_1a0 = local_1a0 + (int)sVar5;
          sVar5 = strcspn(local_1a0," =+");
          iVar2 = (int)sVar5;
          if (0x4a < iVar2) {
            *local_28 = 0xcf;
            return 0xcf;
          }
          iVar4 = iVar2;
          strncat(local_18,local_1a0,(long)iVar2);
          if (iVar2 < 9) {
            ffupch((char *)CONCAT44(iVar4,uVar7));
            iVar3 = fftkey(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
            if (0 < iVar3) {
              *local_18 = '\0';
              strncat(local_18,local_1a0,(long)iVar2);
            }
          }
          local_1a0 = local_1a0 + iVar2;
          if ((*local_1a0 == '+') && (iVar2 < 0x4b)) {
            strcat(local_18,"+");
            return *local_28;
          }
          sVar5 = strspn(local_1a0," ");
          local_1a0 = local_1a0 + (int)sVar5;
          if ((*local_1a0 == '\0') || (*local_1a0 == '=')) {
            return *local_28;
          }
          *local_20 = 0xfffffffe;
          sVar5 = strcspn(local_1a0," ");
          iVar2 = (int)sVar5;
          if (0x28 < iVar4) {
            *local_18 = '\0';
            *local_28 = 0xcf;
            return 0xcf;
          }
          if (0x28 < iVar2) {
            *local_18 = '\0';
            *local_28 = 0xcf;
            return 0xcf;
          }
          strcat(local_18,"                                        ");
          strncpy(local_18 + 0x28,local_1a0,(long)iVar2);
          local_18[0x50] = '\0';
          if (iVar2 < 9) {
            ffupch((char *)CONCAT44(iVar4,uVar7));
            iVar4 = fftkey(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
            if (0 < iVar4) {
              strncpy(local_18 + 0x28,local_1a0,(long)iVar2);
            }
          }
        }
        else {
          sVar5 = strcspn(local_1a0," =");
          iVar2 = (int)sVar5;
          if (0x4a < iVar2) {
            *local_28 = 0xcf;
            return 0xcf;
          }
          strncat(local_78,local_1a0,(long)iVar2);
          if (iVar2 < 9) {
            ffupch((char *)CONCAT44(uVar8,uVar7));
            iVar4 = fftkey(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
            if (0 < iVar4) {
              local_78[0] = '\0';
              strncat(local_78,local_1a0,(long)iVar2);
            }
          }
          if ((('D' < local_78[0]) && (local_78[0] < 'F')) &&
             (iVar4 = strcmp(local_78,"END"), iVar4 == 0)) {
            strcpy(local_18,"END");
            *local_20 = 2;
            return *local_28;
          }
          local_1a0 = local_1a0 + iVar2;
          if ((((('B' < local_78[0]) && (local_78[0] < 'D')) &&
               (iVar2 = strcmp(local_78,"COMMENT"), iVar2 == 0)) ||
              ((('G' < local_78[0] && (local_78[0] < 'I')) &&
               (iVar2 = strcmp(local_78,"HISTORY"), iVar2 == 0)))) ||
             ((('G' < local_78[0] && (local_78[0] < 'I')) &&
              (iVar2 = strcmp(local_78,"HIERARCH"), iVar2 == 0)))) {
            *local_20 = 1;
            strcpy(local_18,local_78);
            strncat(local_18,local_1a0,0x48);
            return *local_28;
          }
          sVar5 = strspn(local_1a0," =");
          local_1a0 = local_1a0 + (int)sVar5;
          if (*local_1a0 == '\'') {
            bVar1 = true;
            iVar2 = 0x8b;
            while (bVar1) {
              local_1a0 = local_1a0 + 1;
              sVar5 = strcspn(local_1a0,"\'");
              iVar4 = (int)sVar5;
              local_1a0 = local_1a0 + -1;
              if (iVar2 < iVar4 + 2) {
                *local_28 = 0xcf;
                return 0xcf;
              }
              strncat(local_108,local_1a0,(long)(iVar4 + 2));
              iVar2 = iVar2 - (iVar4 + 2);
              if (local_1a0[iVar4 + 1] != '\'') {
                *local_28 = 0xcd;
                return 0xcd;
              }
              local_1a0 = local_1a0 + (iVar4 + 1) + 1;
              if (*local_1a0 != '\'') {
                bVar1 = false;
              }
            }
          }
          else if ((*local_1a0 == '/') || (*local_1a0 == '\0')) {
            strcat(local_108," ");
          }
          else {
            sVar5 = strcspn(local_1a0," /");
            local_24c = (int)sVar5;
            if (0x8b < local_24c) {
              *local_28 = 0xcf;
              return 0xcf;
            }
            strncat(local_108,local_1a0,(long)local_24c);
            if (((*local_1a0 != 'T') && (*local_1a0 != 'F')) ||
               ((local_1a0[1] != ' ' && ((local_1a0[1] != '/' && (local_1a0[1] != '\0')))))) {
              local_268 = strtod(local_108,&local_1a8);
              if ((*local_1a8 != '\0') && ((*local_1a8 != ' ' && (*local_1a8 != '/')))) {
                strcpy(local_248,local_108);
                pcVar6 = strchr(local_248,0x44);
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = strchr(local_248,100);
                  if (pcVar6 == (char *)0x0) {
                    pcVar6 = strchr(local_248,0x2e);
                    if (pcVar6 != (char *)0x0) {
                      *pcVar6 = ',';
                      local_268 = strtod(local_248,&local_1a8);
                    }
                  }
                  else {
                    *pcVar6 = 'E';
                    local_268 = strtod(local_248,&local_1a8);
                  }
                }
                else {
                  *pcVar6 = 'E';
                  local_268 = strtod(local_248,&local_1a8);
                }
              }
              if (((*local_1a8 == '\0') || (*local_1a8 == ' ')) || (*local_1a8 == '/')) {
                pcVar6 = strchr(local_108,0x65);
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = strchr(local_108,100);
                  if (pcVar6 != (char *)0x0) {
                    *pcVar6 = 'D';
                  }
                }
                else {
                  *pcVar6 = 'E';
                }
              }
              else {
                if (0x89 < local_24c) {
                  *local_28 = 0xcf;
                  return 0xcf;
                }
                strcpy(local_108,"\'");
                strncat(local_108,local_1a0,(long)local_24c);
                strcat(local_108,"\'");
                if ((local_268 == 0.0) && (!NAN(local_268))) {
                  local_24c = (int)local_268 + local_24c;
                }
              }
            }
            local_1a0 = local_1a0 + local_24c;
          }
          sVar5 = strspn(local_1a0," /");
          local_1a0 = local_1a0 + (int)sVar5;
          sVar5 = strlen(local_108);
          iVar2 = (int)sVar5;
          if (((0 < iVar2) && (iVar2 < 10)) && (local_108[0] == '\'')) {
            local_108[iVar2 + -1] = '\0';
            strncat(local_108,"        ",(long)(10 - iVar2));
            strcat(acStack_ff,"\'");
          }
          strncat(local_198,local_1a0,0x46);
          ffmkky(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        }
        local_4 = *local_28;
      }
    }
    else {
      strncat(local_18,local_10,0x50);
      *local_20 = 1;
      local_4 = *local_28;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgthd(char *tmplt, /* I - input header template string */
           char *card,  /* O - returned FITS header record */
           int *hdtype, /* O - how to interpreter the returned card string */ 
            /*
              -2 = modify the name of a keyword; the old keyword name
                   is returned starting at address chars[0]; the new name
                   is returned starting at address char[40] (to be consistent
                   with the Fortran version).  Both names are null terminated. 
              -1 = card contains the name of a keyword that is to be deleted
               0 = append this keyword if it doesn't already exist, or 
                   modify the value if the keyword already exists.
               1 = append this comment keyword ('HISTORY', 
                   'COMMENT', or blank keyword name) 
               2  =  this is the END keyword; do not write it to the header
            */
           int *status)   /* IO - error status   */
/*
  'Get Template HeaDer'
  parse a template header line and create a formated
  character string which is suitable for appending to a FITS header 
*/
{
    char keyname[FLEN_KEYWORD], value[140], comment[140];
    char *tok, *suffix, *loc, tvalue[140];
    int len, vlen, more, tstatus, lentok1=0, remainlen=0;
    double dval;

    if (*status > 0)
        return(*status);

    card[0]   = '\0';
    *hdtype   = 0;

    if (!FSTRNCMP(tmplt, "        ", 8) )
    {
        /* if first 8 chars of template are blank, then this is a comment */
        strncat(card, tmplt, 80);
        *hdtype = 1;
        return(*status);
    }

    tok = tmplt;   /* point to start of template string */
 
    keyname[0] = '\0';
    value[0]   = '\0';
    comment[0] = '\0';

    len = strspn(tok, " ");  /* no. of spaces before keyword */
    tok += len;

    /* test for pecular case where token is a string of dashes */
    if (strncmp(tok, "--------------------", 20) == 0)
            return(*status = BAD_KEYCHAR);

    if (tok[0] == '-')  /* is there a leading minus sign? */
    {
        /* first token is name of keyword to be deleted or renamed */
        *hdtype = -1;
        tok++;
        len = strspn(tok, " ");  /* no. of spaces before keyword */
        tok += len;
        
        len = strcspn(tok, " =+");  /* length of name */
        if (len >= FLEN_KEYWORD)
          return(*status = BAD_KEYCHAR);

        lentok1 = len;
        strncat(card, tok, len);

        /*
          The HIERARCH convention supports non-standard characters
          in the keyword name, so don't always convert to upper case or
          abort if there are illegal characters in the name or if the
          name is greater than 8 characters long.
        */

        if (len < 9)  /* this is possibly a normal FITS keyword name */
        {
          ffupch(card);
          tstatus = 0;
          if (fftkey(card, &tstatus) > 0)
          {
             /* name contained non-standard characters, so reset */
             card[0] = '\0';
             strncat(card, tok, len);
          }
        }

        tok += len;

	/* Check optional "+" indicator to delete multiple keywords */
	if (tok[0] == '+' && len < FLEN_KEYWORD) {
	  strcat(card, "+");
	  return (*status);
	}

        /* second token, if present, is the new name for the keyword */

        len = strspn(tok, " ");  /* no. of spaces before next token */
        tok += len;

        if (tok[0] == '\0' || tok[0] == '=')
            return(*status);  /* no second token */

        *hdtype = -2;
        len = strcspn(tok, " ");  /* length of new name */
        /* this name has to fit on columns 41-80 of card,
           and first name must now fit in 1-40 */
        if (lentok1 > 40)
        {
           card[0] = '\0';
           return (*status = BAD_KEYCHAR);
        }
        if (len > 40)
        {
           card[0] = '\0'; 
           return(*status = BAD_KEYCHAR);
        }

        /* copy the new name to card + 40;  This is awkward, */
        /* but is consistent with the way the Fortran FITSIO works */
	strcat(card,"                                        ");
        strncpy(&card[40], tok, len);
        card[80] = '\0'; /* necessary to add terminator in case len = 40 */

        /*
            The HIERARCH convention supports non-standard characters
            in the keyword name, so don't always convert to upper case or
            abort if there are illegal characters in the name or if the
            name is greater than 8 characters long.
        */

        if (len < 9)  /* this is possibly a normal FITS keyword name */
        {
            ffupch(&card[40]);
            tstatus = 0;
            if (fftkey(&card[40], &tstatus) > 0)
            {
               /* name contained non-standard characters, so reset */
               strncpy(&card[40], tok, len);
            }
        }
    }
    else  /* no negative sign at beginning of template */
    {
      /* get the keyword name token */

      len = strcspn(tok, " =");  /* length of keyword name */
      if (len >= FLEN_KEYWORD)
        return(*status = BAD_KEYCHAR);

      strncat(keyname, tok, len);

      /*
        The HIERARCH convention supports non-standard characters
        in the keyword name, so don't always convert to upper case or
        abort if there are illegal characters in the name or if the
        name is greater than 8 characters long.
      */

      if (len < 9)  /* this is possibly a normal FITS keyword name */
      {
        ffupch(keyname);
        tstatus = 0;
        if (fftkey(keyname, &tstatus) > 0)
        {
           /* name contained non-standard characters, so reset */
           keyname[0] = '\0';
           strncat(keyname, tok, len);
        }
      }

      if (!FSTRCMP(keyname, "END") )
      {
         strcpy(card, "END");
         *hdtype = 2;
         return(*status);
      }

      tok += len; /* move token pointer to end of the keyword */

      if (!FSTRCMP(keyname, "COMMENT") || !FSTRCMP(keyname, "HISTORY")
         || !FSTRCMP(keyname, "HIERARCH") )
      {
        *hdtype = 1;   /* simply append COMMENT and HISTORY keywords */
        strcpy(card, keyname);
        strncat(card, tok, 72);
        return(*status);
      }

      /* look for the value token */
      len = strspn(tok, " =");  /* spaces or = between name and value */
      tok += len;

      if (*tok == '\'') /* is value enclosed in quotes? */
      {
          more = TRUE;
          remainlen = 139;
          while (more)
          {
            tok++;  /* temporarily move past the quote char */
            len = strcspn(tok, "'");  /* length of quoted string */
            tok--;
            if (len+2 > remainlen)
               return (*status=BAD_KEYCHAR);
            strncat(value, tok, len + 2);
            remainlen -= (len+2); 
 
            tok += len + 1;
            if (tok[0] != '\'')   /* check there is a closing quote */
              return(*status = NO_QUOTE);

            tok++;
            if (tok[0] != '\'')  /* 2 quote chars = literal quote */
              more = FALSE;
          }
      }
      else if (*tok == '/' || *tok == '\0')  /* There is no value */
      {
          strcat(value, " ");
      }
      else   /* not a quoted string value */
      {
          len = strcspn(tok, " /"); /* length of value string */
          if (len > 139)
             return (*status=BAD_KEYCHAR);
          strncat(value, tok, len);
          if (!( (tok[0] == 'T' || tok[0] == 'F') &&
                 (tok[1] == ' ' || tok[1] == '/' || tok[1] == '\0') )) 
          {
             /* not a logical value */

            dval = strtod(value, &suffix); /* try to read value as number */

            if (*suffix != '\0' && *suffix != ' ' && *suffix != '/')
            { 
                /* value not recognized as a number; might be because it */
                /* contains a 'd' or 'D' exponent character  */ 
                strcpy(tvalue, value);
                if ((loc = strchr(tvalue, 'D')))
                {          
                    *loc = 'E'; /*  replace D's with E's. */ 
                    dval = strtod(tvalue, &suffix); /* read value again */
                }
                else if ((loc = strchr(tvalue, 'd')))
                {
                    *loc = 'E'; /*  replace d's with E's. */ 
                    dval = strtod(tvalue, &suffix); /* read value again */
                }
                else if ((loc = strchr(tvalue, '.')))
                {
                    *loc = ','; /*  replace period with a comma */ 
                    dval = strtod(tvalue, &suffix); /* read value again */
                }
            }
   
            if (*suffix != '\0' && *suffix != ' ' && *suffix != '/')
            { 
              /* value is not a number; must enclose it in quotes */
              if (len > 137)
                return (*status=BAD_KEYCHAR);              
              strcpy(value, "'");
              strncat(value, tok, len);
              strcat(value, "'");

              /* the following useless statement stops the compiler warning */
              /* that dval is not used anywhere */
              if (dval == 0.)
                 len += (int) dval; 
            }
            else  
            {
                /* value is a number; convert any 'e' to 'E', or 'd' to 'D' */
                loc = strchr(value, 'e');
                if (loc)
                {          
                    *loc = 'E';  
                }
                else
                {
                    loc = strchr(value, 'd');
                    if (loc)
                    {          
                        *loc = 'D';  
                    }
                }
            }
          }
          tok += len;
      }

      len = strspn(tok, " /"); /* no. of spaces between value and comment */
      tok += len;

      vlen = strlen(value);
      if (vlen > 0 && vlen < 10 && value[0] == '\'')
      {
          /* pad quoted string with blanks so it is at least 8 chars long */
          value[vlen-1] = '\0';
          strncat(value, "        ", 10 - vlen);
          strcat(&value[9], "'");
      }

      /* get the comment string */
      strncat(comment, tok, 70);

      /* construct the complete FITS header card */
      ffmkky(keyname, value, comment, card, status);
    }
    return(*status);
}